

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  int threshold;
  int threshold_00;
  int iVar1;
  Scalar_<double> local_398;
  _InputArray local_378;
  _InputArray local_358;
  vector<Descriptor,_std::allocator<Descriptor>_> keyPointDescriptor2;
  vector<Descriptor,_std::allocator<Descriptor>_> keyPointDescriptor1;
  vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_> featurePoints2;
  vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_> featurePoints1;
  _InputArray local_2c0;
  Mat origImage1;
  vector<cv::DMatch,_std::allocator<cv::DMatch>_> dMatch;
  vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_> keyPoint2;
  vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_> keyPoint1;
  _InputOutputArray local_1f0;
  _Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_> local_1d8;
  _Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_> local_1c0;
  Mat out;
  _Vector_base<char,_std::allocator<char>_> local_148;
  String fileName2;
  String fileName1;
  Mat origImage2;
  Mat featurePointsImg;
  
  std::__cxx11::string::string((string *)&fileName1,argv[1],(allocator *)&origImage1);
  std::__cxx11::string::string((string *)&fileName2,argv[2],(allocator *)&origImage1);
  std::__cxx11::string::string((string *)&origImage1,argv[3],(allocator *)&origImage2);
  threshold = std::__cxx11::stoi((string *)&origImage1,(size_t *)0x0,10);
  std::__cxx11::string::~string((string *)&origImage1);
  std::__cxx11::string::string((string *)&origImage1,argv[4],(allocator *)&origImage2);
  threshold_00 = std::__cxx11::stoi((string *)&origImage1,(size_t *)0x0,10);
  std::__cxx11::string::~string((string *)&origImage1);
  std::__cxx11::string::string((string *)&origImage1,argv[5],(allocator *)&origImage2);
  iVar1 = std::__cxx11::stoi((string *)&origImage1,(size_t *)0x0,10);
  std::__cxx11::string::~string((string *)&origImage1);
  cv::imread((string *)&origImage1,(int)&fileName1);
  featurePoints1.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  featurePoints1.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  featurePoints1.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  harrisCorner(&origImage1,&featurePoints1,threshold,0 < iVar1);
  cv::imread((string *)&origImage2,(int)&fileName2);
  featurePoints2.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  featurePoints2.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  featurePoints2.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  harrisCorner(&origImage2,&featurePoints2,threshold,0 < iVar1);
  cv::Mat::Mat(&featurePointsImg);
  local_398.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2] = 0.0;
  local_378.sz.width = 0;
  local_378.sz.height = 0;
  local_398.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0]._0_4_ = 0x1010000;
  local_378.flags = 0x3010000;
  local_398.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1] = (double)&origImage1;
  local_378.obj = &featurePointsImg;
  cv::Scalar_<double>::all((Scalar_<double> *)&out,-1.0);
  cv::drawKeypoints((_InputArray *)&local_398,(vector *)&featurePoints1,
                    (_InputOutputArray *)&local_378,(Scalar_ *)&out,DEFAULT);
  std::__cxx11::string::string((string *)&out,"Key Points",(allocator *)&local_378);
  local_398.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2] = 0.0;
  local_398.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0]._0_4_ = 0x1010000;
  local_398.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1] = (double)&featurePointsImg;
  cv::imshow((string *)&out,(_InputArray *)&local_398);
  std::__cxx11::string::~string((string *)&out);
  cv::waitKey(0);
  local_398.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2] = 0.0;
  local_378.sz.width = 0;
  local_378.sz.height = 0;
  local_398.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0]._0_4_ = 0x1010000;
  local_378.flags = 0x3010000;
  local_398.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1] = (double)&origImage2;
  local_378.obj = &featurePointsImg;
  cv::Scalar_<double>::all((Scalar_<double> *)&out,-1.0);
  cv::drawKeypoints((_InputArray *)&local_398,(vector *)&featurePoints2,
                    (_InputOutputArray *)&local_378,(Scalar_ *)&out,DEFAULT);
  std::__cxx11::string::string((string *)&out,"Key Points",(allocator *)&local_378);
  local_398.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2] = 0.0;
  local_398.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0]._0_4_ = 0x1010000;
  local_398.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1] = (double)&featurePointsImg;
  cv::imshow((string *)&out,(_InputArray *)&local_398);
  std::__cxx11::string::~string((string *)&out);
  cv::waitKey(0);
  keyPointDescriptor1.super__Vector_base<Descriptor,_std::allocator<Descriptor>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  keyPointDescriptor1.super__Vector_base<Descriptor,_std::allocator<Descriptor>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  keyPointDescriptor1.super__Vector_base<Descriptor,_std::allocator<Descriptor>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>::vector
            ((vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_> *)&local_1c0,&featurePoints1);
  generateDescriptor(&origImage1,(vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_> *)&local_1c0,
                     &keyPointDescriptor1);
  std::_Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>::~_Vector_base(&local_1c0);
  keyPointDescriptor2.super__Vector_base<Descriptor,_std::allocator<Descriptor>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  keyPointDescriptor2.super__Vector_base<Descriptor,_std::allocator<Descriptor>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  keyPointDescriptor2.super__Vector_base<Descriptor,_std::allocator<Descriptor>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>::vector
            ((vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_> *)&local_1d8,&featurePoints2);
  generateDescriptor(&origImage2,(vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_> *)&local_1d8,
                     &keyPointDescriptor2);
  std::_Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>::~_Vector_base(&local_1d8);
  keyPoint1.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  keyPoint1.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  keyPoint1.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  keyPoint2.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  keyPoint2.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  keyPoint2.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  dMatch.super__Vector_base<cv::DMatch,_std::allocator<cv::DMatch>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  dMatch.super__Vector_base<cv::DMatch,_std::allocator<cv::DMatch>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  dMatch.super__Vector_base<cv::DMatch,_std::allocator<cv::DMatch>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  findMatch(&keyPointDescriptor1,&keyPointDescriptor2,&keyPoint1,&keyPoint2,&dMatch,threshold_00);
  cv::Mat::Mat(&out);
  local_358.sz.width = 0;
  local_358.sz.height = 0;
  local_358.flags = 0x1010000;
  local_2c0.sz.width = 0;
  local_2c0.sz.height = 0;
  local_1f0.super__OutputArray.super__InputArray.sz.width = 0;
  local_1f0.super__OutputArray.super__InputArray.sz.height = 0;
  local_2c0.flags = 0x1010000;
  local_1f0.super__OutputArray.super__InputArray.flags = 0x3010000;
  local_358.obj = &origImage1;
  local_2c0.obj = &origImage2;
  local_1f0.super__OutputArray.super__InputArray.obj = (string *)&out;
  cv::Scalar_<double>::all(&local_398,-1.0);
  cv::Scalar_<double>::all((Scalar_<double> *)&local_378,-1.0);
  local_148._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_148._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_148._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cv::drawMatches(&local_358,(vector *)&keyPoint1,&local_2c0,(vector *)&keyPoint2,(vector *)&dMatch,
                  &local_1f0,(Scalar_ *)&local_398,(Scalar_ *)&local_378,(vector *)&local_148,
                  DEFAULT);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base(&local_148);
  std::__cxx11::string::string((string *)&local_398,"Match",(allocator *)&local_358);
  local_378.sz.width = 0;
  local_378.sz.height = 0;
  local_378.flags = 0x1010000;
  local_378.obj = (string *)&out;
  cv::imshow((string *)&local_398,&local_378);
  std::__cxx11::string::~string((string *)&local_398);
  cv::waitKey(0);
  std::__cxx11::string::string((string *)&local_398,"screenshot.png",(allocator *)&local_2c0);
  local_378.sz.width = 0;
  local_378.sz.height = 0;
  local_378.flags = 0x1010000;
  local_358.flags = 0;
  local_358._4_4_ = 0;
  local_358.obj = (void *)0x0;
  local_358.sz.width = 0;
  local_358.sz.height = 0;
  local_378.obj = (string *)&out;
  cv::imwrite((string *)&local_398,&local_378,(vector *)&local_358);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_358);
  std::__cxx11::string::~string((string *)&local_398);
  cv::Mat::~Mat(&out);
  std::_Vector_base<cv::DMatch,_std::allocator<cv::DMatch>_>::~_Vector_base
            (&dMatch.super__Vector_base<cv::DMatch,_std::allocator<cv::DMatch>_>);
  std::_Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>::~_Vector_base
            (&keyPoint2.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>);
  std::_Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>::~_Vector_base
            (&keyPoint1.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>);
  std::vector<Descriptor,_std::allocator<Descriptor>_>::~vector(&keyPointDescriptor2);
  std::vector<Descriptor,_std::allocator<Descriptor>_>::~vector(&keyPointDescriptor1);
  cv::Mat::~Mat(&featurePointsImg);
  std::_Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>::~_Vector_base
            (&featurePoints2.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>);
  cv::Mat::~Mat(&origImage2);
  std::_Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>::~_Vector_base
            (&featurePoints1.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>);
  cv::Mat::~Mat(&origImage1);
  std::__cxx11::string::~string((string *)&fileName2);
  std::__cxx11::string::~string((string *)&fileName1);
  return 0;
}

Assistant:

int main(int argc, char* argv[]) {

	String fileName1 = argv[1];
	String fileName2 = argv[2];
	int thresholdFeature = stoi(argv[3]);
	int thresholdMatch = stoi(argv[4]);
	int useANMS = stoi(argv[5]);
	bool isANMS = (useANMS > 0) ? true : false;

	Mat origImage1 = imread(fileName1);
	vector<KeyPoint> featurePoints1;
	harrisCorner(origImage1, featurePoints1, thresholdFeature,isANMS);

	Mat origImage2 = imread(fileName2);
	vector<KeyPoint> featurePoints2;
	harrisCorner(origImage2, featurePoints2, thresholdFeature,isANMS);

	Mat featurePointsImg;
	drawKeypoints(origImage1, featurePoints1, featurePointsImg);
	imshow("Key Points", featurePointsImg);
	waitKey();

	drawKeypoints(origImage2, featurePoints2, featurePointsImg);
	imshow("Key Points", featurePointsImg);
	waitKey();

	vector<Descriptor> keyPointDescriptor1;
	generateDescriptor(origImage1, featurePoints1, keyPointDescriptor1);

	vector<Descriptor> keyPointDescriptor2;
	generateDescriptor(origImage2, featurePoints2, keyPointDescriptor2);

	vector<KeyPoint> keyPoint1;
	vector<KeyPoint> keyPoint2;
	vector<DMatch> dMatch;
	findMatch(keyPointDescriptor1, keyPointDescriptor2, keyPoint1, keyPoint2, dMatch, thresholdMatch);

	Mat out;
	drawMatches(origImage1, keyPoint1, origImage2, keyPoint2, dMatch,out);
	imshow("Match", out);
	waitKey();
	imwrite("screenshot.png", out);

}